

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O1

void gba_write_word(uint32_t addr,uint32_t value,access_type_t access_type)

{
  uint16_t old_value;
  gbamem_t *pgVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint uVar4;
  ulong uVar5;
  addr_27b_t *paVar6;
  gba_ppu_t **ppgVar7;
  gbabus_t **ppgVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t *warr;
  addr_27b_t *paVar12;
  int *piVar13;
  undefined8 uVar14;
  uint8_t uVar15;
  ushort uVar16;
  gbabus_t *pgVar17;
  ushort uVar18;
  uint uVar19;
  int iVar20;
  uint32_t uVar21;
  char *pcVar22;
  uint32_t mirrored;
  long lVar23;
  gba_ppu_t *pgVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  
  uVar10 = addr >> 0x18;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar13 = nonsequential_word_cycles;
LAB_00115018:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar13[uVar10];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar13 = sequential_word_cycles;
    goto LAB_00115018;
  }
  pgVar1 = mem;
  pgVar24 = ppu;
  if (0xf < uVar10) {
    return;
  }
  uVar26 = addr & 0xfffffffc;
  uVar15 = (uint8_t)value;
  uVar16 = (ushort)(value >> 0x10);
  uVar18 = (ushort)value;
  switch((ulong)uVar10) {
  case 0:
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar22 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_00115122:
    printf(pcVar22);
    return;
  case 1:
    goto switchD_00115049_caseD_1;
  case 2:
    *(uint32_t *)(mem->ewram + (addr & 0x3fffc)) = value;
    return;
  case 3:
    *(uint32_t *)(mem->iwram + (addr & 0x7ffc)) = value;
    return;
  case 4:
    break;
  case 5:
    *(uint32_t *)(ppu->pram + (addr & 0x3fc)) = value;
    return;
  case 6:
    *(uint32_t *)(ppu->vram + (uVar26 + 0xfa000000) % 0x18000) = value;
    return;
  case 7:
    ppu->oam[addr & 0x3fc] = uVar15;
    *(uint32_t *)(ppu->oam + (addr & 0x3fc)) = value;
    return;
  case 8:
    if (uVar26 == 0x80000c8) {
      uVar21 = 0x80000c8;
LAB_00115270:
      gpio_write(uVar21,uVar18);
      return;
    }
    if (uVar26 == 0x80000c4) {
      gpio_write(0x80000c4,uVar18);
      uVar21 = 0x80000c6;
      uVar18 = uVar16;
      goto LAB_00115270;
    }
  case 0xd:
    if ((bus->backup_type == EEPROM) && ((0xdfffeff < addr || (mem->rom_size < 0x1000001)))) {
LAB_001181b7:
      gba_write_word_cold_4();
LAB_001181c1:
      gba_write_word_cold_28();
      goto LAB_001181c6;
    }
    if (gba_log_verbosity < 3) {
      return;
    }
    pcVar22 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
    goto LAB_00115250;
  default:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar22 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
      goto LAB_00115122;
    case SRAM:
      *(uint32_t *)(mem->backup + (addr & 0x7ffc)) = value;
      pgVar1->backup_dirty = true;
      return;
    case FLASH64K:
    case FLASH128K:
      gba_write_word_cold_1();
    default:
      gba_write_word_cold_3();
    case EEPROM:
      gba_write_word_cold_2();
    }
    goto LAB_001181b7;
  }
  if (0x40003ff < addr) {
    return;
  }
  uVar25 = addr & 0x700fffc;
  uVar10 = uVar26;
  if (uVar25 == 0x4000800) {
    uVar10 = 0x4000800;
  }
  if (uVar10 < 0x4000804) {
    uVar5 = 0x800;
    if ((uVar10 & 0x700fffc) != 0x4000800) {
      uVar5 = (ulong)(uVar10 + 0xfc000000);
    }
    uVar2 = io_register_sizes[uVar5];
  }
  else {
    uVar2 = '\0';
  }
  if (uVar2 == '\x04') {
    if (uVar10 < 0x4000804) {
      uVar5 = 0x800;
      if ((uVar10 & 0x700fffc) != 0x4000800) {
        uVar5 = (ulong)(uVar10 + 0xfc000000);
      }
      bVar27 = (io_register_access[uVar5] & ~R) == W;
    }
    else {
      bVar27 = false;
    }
    if ((!bVar27) && (gba_log_verbosity != 0)) {
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m");
    }
    pgVar24 = ppu;
    uVar25 = addr & 0xffc;
    if ((uVar25 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar25 & 0x3f) & 1) != 0)) {
      if ((uVar25 - 0x28 < 0x18) &&
         (uVar10 = uVar25 - 0x28 >> 2, (0x33U >> (uVar10 & 0x1f) & 1) != 0)) {
        lVar23 = *(long *)(&DAT_00127428 + (ulong)uVar10 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint32_t *)
           ((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00127458 + (ulong)uVar10 * 8)) = value
          ;
        }
        *(uint32_t *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) = value;
        return;
      }
      goto LAB_001181c1;
    }
    if (uVar25 == 0xa4) {
      iVar20 = 1;
LAB_001157a9:
      uVar21 = 0xffffffff;
      goto LAB_001157b0;
    }
    if (uVar25 == 0xa0) {
      iVar20 = 0;
      goto LAB_001157a9;
    }
    if (0x4000803 < uVar10) {
LAB_0011598b:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
      goto LAB_00115250;
    }
    uVar5 = 0x800;
    if ((uVar10 & 0x700fffc) != 0x4000800) {
      uVar5 = (ulong)(uVar10 + 0xfc000000);
    }
    if ((io_register_access[uVar5] & ~R) != W) goto LAB_0011598b;
    if (0x4000803 < uVar10) goto LAB_00118201;
    uVar5 = (ulong)(uVar10 + 0xfc000000);
    if ((uVar10 & 0x700fffc) == 0x4000800) {
      uVar5 = 0x800;
    }
    if (io_register_sizes[uVar5] != '\x04') goto LAB_00118201;
    paVar6 = (addr_27b_t *)0x0;
    paVar12 = (addr_27b_t *)0x0;
    if (uVar25 < 0xbc) {
      if (uVar25 < 0xa0) {
        if (uVar25 < 0x38) {
          if (uVar25 == 0x28) {
            lVar23 = 0x3ecac;
          }
          else {
            if (uVar25 != 0x2c) goto LAB_00118237;
            lVar23 = 0x3ecb4;
          }
        }
        else if (uVar25 == 0x38) {
          lVar23 = 0x3ecbc;
        }
        else {
          if (uVar25 != 0x3c) goto LAB_00118237;
          lVar23 = 0x3ecc4;
        }
        paVar12 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar23);
      }
      else if (uVar25 < 0xb0) {
        if ((uVar25 != 0xa0) && (uVar25 != 0xa4)) goto LAB_00118237;
      }
      else if (uVar25 == 0xb0) {
        paVar12 = &bus->DMA0SAD;
      }
      else {
        if (uVar25 != 0xb4) goto LAB_00118237;
        paVar12 = &bus->DMA0DAD;
      }
LAB_00116fef:
      if (paVar12 != (addr_27b_t *)0x0) {
        paVar12->raw = value;
        return;
      }
      if (gba_log_verbosity == 0) {
        return;
      }
      uVar14 = 0xffffffff;
      goto LAB_00117015;
    }
    if (uVar25 < 0xd4) {
      if (uVar25 < 200) {
        if (uVar25 == 0xbc) {
          paVar12 = (addr_27b_t *)&bus->DMA1SAD;
        }
        else {
          if (uVar25 != 0xc0) goto LAB_00118237;
          paVar12 = &bus->DMA1DAD;
        }
      }
      else if (uVar25 == 200) {
        paVar12 = (addr_27b_t *)&bus->DMA2SAD;
      }
      else {
        if (uVar25 != 0xcc) goto LAB_00118237;
        paVar12 = &bus->DMA2DAD;
      }
      goto LAB_00116fef;
    }
    if (uVar25 < 0x150) {
      if (uVar25 == 0xd4) {
        paVar12 = (addr_27b_t *)&bus->DMA3SAD;
      }
      else {
        if (uVar25 != 0xd8) goto LAB_00118237;
        paVar12 = (addr_27b_t *)&bus->DMA3DAD;
      }
      goto LAB_00116fef;
    }
    paVar12 = paVar6;
    if (((uVar25 == 0x150) || (uVar25 == 0x154)) || (uVar25 == 0x800)) goto LAB_00116fef;
    goto LAB_00118237;
  }
  if (uVar2 != '\x02') {
    if (uVar2 != '\x01') {
      return;
    }
    if (0x4000803 < uVar10) {
LAB_00115453:
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00115466;
      }
      goto LAB_00115470;
    }
    uVar19 = uVar10 & 0x700fffc;
    uVar11 = uVar10 + 0xfc000000;
    uVar5 = 0x800;
    if (uVar19 != 0x4000800) {
      uVar5 = (ulong)uVar11;
    }
    if ((io_register_access[uVar5] & ~R) != W) goto LAB_00115453;
    if (uVar10 < 0x4000804) {
      uVar5 = 0x800;
      if (uVar19 != 0x4000800) {
        uVar5 = (ulong)uVar11;
      }
      uVar2 = io_register_sizes[uVar5];
    }
    else {
      uVar2 = '\0';
    }
    if (uVar2 == '\x04') {
      uVar4 = addr & 0xffc;
      if ((uVar4 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        if ((uVar4 - 0x28 < 0x18) &&
           (uVar11 = uVar4 - 0x28 >> 2, (0x33U >> (uVar11 & 0x1f) & 1) != 0)) {
          lVar23 = *(long *)(&DAT_00127428 + (ulong)uVar11 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint8_t *)
             ((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00127458 + (ulong)uVar11 * 8)) =
                 uVar15;
          }
          *(uint8_t *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) = uVar15;
          goto LAB_00115470;
        }
        goto LAB_001181f2;
      }
      if (uVar4 == 0xa4) {
        iVar20 = 1;
LAB_00115ff7:
        write_fifo(apu,iVar20,value & 0xff,0xff);
        goto LAB_00115470;
      }
      if (uVar4 == 0xa0) {
        iVar20 = 0;
        goto LAB_00115ff7;
      }
      if (0x4000803 < uVar10) {
LAB_001160d1:
        if (gba_log_verbosity == 0) goto LAB_00115470;
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00115466;
      }
      uVar5 = 0x800;
      if (uVar19 != 0x4000800) {
        uVar5 = (ulong)uVar11;
      }
      if ((io_register_access[uVar5] & ~R) != W) goto LAB_001160d1;
      if (uVar10 < 0x4000804) {
        uVar5 = (ulong)uVar11;
        if (uVar19 == 0x4000800) {
          uVar5 = 0x800;
        }
        if (io_register_sizes[uVar5] == '\x04') {
          paVar6 = (addr_27b_t *)0x0;
          paVar12 = (addr_27b_t *)0x0;
          if (uVar4 < 0xbc) {
            if (uVar4 < 0xa0) {
              if (uVar4 < 0x38) {
                if (uVar4 == 0x28) {
                  lVar23 = 0x3ecac;
                }
                else {
                  if (uVar4 != 0x2c) goto LAB_00118267;
                  lVar23 = 0x3ecb4;
                }
              }
              else if (uVar4 == 0x38) {
                lVar23 = 0x3ecbc;
              }
              else {
                if (uVar4 != 0x3c) goto LAB_00118267;
                lVar23 = 0x3ecc4;
              }
              paVar12 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar23);
            }
            else if (uVar4 < 0xb0) {
              if ((uVar4 != 0xa0) && (uVar4 != 0xa4)) goto LAB_00118267;
            }
            else if (uVar4 == 0xb0) {
              paVar12 = &bus->DMA0SAD;
            }
            else {
              if (uVar4 != 0xb4) goto LAB_00118267;
              paVar12 = &bus->DMA0DAD;
            }
          }
          else if (uVar4 < 0xd4) {
            if (uVar4 < 200) {
              if (uVar4 == 0xbc) {
                paVar12 = (addr_27b_t *)&bus->DMA1SAD;
              }
              else {
                if (uVar4 != 0xc0) goto LAB_00118267;
                paVar12 = &bus->DMA1DAD;
              }
            }
            else if (uVar4 == 200) {
              paVar12 = (addr_27b_t *)&bus->DMA2SAD;
            }
            else {
              if (uVar4 != 0xcc) goto LAB_00118267;
              paVar12 = &bus->DMA2DAD;
            }
          }
          else if (uVar4 < 0x150) {
            if (uVar4 == 0xd4) {
              paVar12 = (addr_27b_t *)&bus->DMA3SAD;
            }
            else {
              if (uVar4 != 0xd8) goto LAB_00118267;
              paVar12 = (addr_27b_t *)&bus->DMA3DAD;
            }
          }
          else {
            paVar12 = paVar6;
            if (((uVar4 != 0x150) && (uVar4 != 0x154)) && (uVar4 != 0x800)) goto LAB_00118267;
          }
          if (paVar12 == (addr_27b_t *)0x0) {
            if (gba_log_verbosity != 0) {
              printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                     ,(ulong)uVar26,0xff);
            }
          }
          else {
            *(uint8_t *)paVar12 = uVar15;
          }
          goto LAB_00115470;
        }
      }
      goto LAB_0011822a;
    }
    if (uVar2 != '\x02') {
      if ((addr & 0xffc) == 0x300) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
        }
        goto LAB_00115470;
      }
      goto LAB_001181f7;
    }
    uVar11 = addr & 0xffc;
    switch(uVar11 >> 2) {
    case 0:
      lVar23 = 0x3ec34;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 1:
      lVar23 = 0x3eccc;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 2:
      lVar23 = 0x3ec38;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 3:
      lVar23 = 0x3ec40;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 4:
      lVar23 = 0x3ec48;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 5:
      lVar23 = 0x3ec50;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 6:
      lVar23 = 0x3ec58;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 7:
      lVar23 = 0x3ec60;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 8:
      lVar23 = 0x3ec68;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 9:
      lVar23 = 0x3ec70;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    default:
      goto switchD_001158dd_caseD_a;
    case 0xc:
      lVar23 = 0x3ec78;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0xd:
      lVar23 = 0x3ec80;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x10:
      lVar23 = 0x3ec88;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x11:
      lVar23 = 0x3ec90;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x12:
      lVar23 = 0x3ec98;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x13:
      lVar23 = 0x3ec9c;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x14:
      lVar23 = 0x3eca0;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x15:
      lVar23 = 0x3eca8;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      if (gba_log_verbosity == 0) goto LAB_001160ca;
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_001160be:
      pgVar17 = (gbabus_t *)0x0;
      printf(pcVar22,(ulong)uVar11);
      goto LAB_001172e5;
    case 0x22:
      ppgVar8 = &bus;
      lVar23 = 0x96;
      break;
    case 0x2e:
      pgVar17 = (gbabus_t *)&bus->DMA0CNT_L;
      goto LAB_001172e5;
    case 0x31:
      pgVar17 = (gbabus_t *)&bus->DMA1CNT_L;
      goto LAB_001172e5;
    case 0x34:
      pgVar17 = (gbabus_t *)&bus->DMA2CNT_L;
      goto LAB_001172e5;
    case 0x37:
      pgVar17 = (gbabus_t *)&bus->DMA3CNT_L;
      goto LAB_001172e5;
    case 0x40:
      ppgVar8 = &bus;
      lVar23 = 0xa2;
      break;
    case 0x41:
      ppgVar8 = &bus;
      lVar23 = 0xa4;
      break;
    case 0x42:
      ppgVar8 = &bus;
      lVar23 = 0xa6;
      break;
    case 0x43:
      ppgVar8 = &bus;
      lVar23 = 0xa8;
      break;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x54:
    case 0x55:
    case 0x56:
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_001160be;
      }
LAB_001160ca:
      pgVar17 = (gbabus_t *)0x0;
      goto LAB_001172e5;
    case 0x4c:
      pgVar17 = (gbabus_t *)&bus->KEYINPUT;
      goto LAB_001172e5;
    case 0x4d:
      ppgVar8 = &bus;
      lVar23 = 0x90;
      break;
    case 0x50:
      ppgVar8 = &bus;
      lVar23 = 0x92;
      break;
    case 0x80:
      pgVar17 = (gbabus_t *)&bus->interrupt_enable;
      goto LAB_001172e5;
    case 0x81:
      ppgVar8 = &bus;
      lVar23 = 0xcc;
      break;
    case 0x82:
      pgVar17 = bus;
      goto LAB_001172e5;
    }
    pgVar17 = (gbabus_t *)((long)((gba_ppu_t *)*ppgVar8)->screen + lVar23 + -2);
LAB_001172e5:
    if (pgVar17 == (gbabus_t *)0x0) {
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
LAB_00115466:
        printf(pcVar22,(ulong)uVar26);
      }
    }
    else {
      uVar9 = 0xff;
      if (uVar11 == 0x208) {
        uVar9 = 1;
      }
      uVar3 = 0xf8;
      if (uVar11 != 4) {
        uVar3 = uVar9;
      }
      (pgVar17->interrupt_master_enable).raw =
           (uVar18 ^ (pgVar17->interrupt_master_enable).raw) & uVar3 ^
           (pgVar17->interrupt_master_enable).raw;
      if ((uVar11 - 0xb8 < 0x25) && ((0x1001001001U >> ((ulong)(uVar11 - 0xb8) & 0x3f) & 1) != 0)) {
        gba_dma();
      }
      else if (uVar11 == 0x204) {
        on_waitcnt_updated();
      }
    }
LAB_00115470:
    pgVar24 = ppu;
    if ((io_register_access[uVar26 + 0xfc000001] & ~R) != W) {
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00115610;
      }
      goto LAB_00116777;
    }
    if (io_register_sizes[uVar26 + 0xfc000001] == '\x04') {
      uVar19 = value & 0xff00;
      uVar11 = addr & 0xffc;
      if ((uVar11 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar11 & 0x3f) & 1) != 0)) {
        if ((uVar11 - 0x28 < 0x18) &&
           (uVar11 = uVar11 - 0x28 >> 2, (0x33U >> (uVar11 & 0x1f) & 1) != 0)) {
          lVar23 = *(long *)(&DAT_00127428 + (ulong)uVar11 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be +
                     *(long *)(&DAT_00127458 + (ulong)uVar11 * 8)) =
                 *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00127458 + (ulong)uVar11 * 8)) & 0xffff00ff | uVar19;
          }
          *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) =
               *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) & 0xffff00ff | uVar19;
          goto LAB_00116777;
        }
        goto LAB_001181e1;
      }
      if (uVar11 == 0xa4) {
        iVar20 = 1;
LAB_00115ca9:
        write_fifo(apu,iVar20,uVar19,0xff00);
        goto LAB_00116777;
      }
      if (uVar11 == 0xa0) {
        iVar20 = 0;
        goto LAB_00115ca9;
      }
      if (0x4000803 < uVar10) {
LAB_00115d95:
        if (gba_log_verbosity != 0) {
          pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00115610;
        }
        goto LAB_00116777;
      }
      uVar5 = 0x800;
      if ((uVar10 & 0x700fffc) != 0x4000800) {
        uVar5 = (ulong)(uVar10 + 0xfc000000);
      }
      if ((io_register_access[uVar5] & ~R) != W) goto LAB_00115d95;
      if (0x4000803 < uVar10) goto LAB_00118217;
      uVar5 = (ulong)(uVar10 + 0xfc000000);
      if ((uVar10 & 0x700fffc) == 0x4000800) {
        uVar5 = 0x800;
      }
      if (io_register_sizes[uVar5] != '\x04') goto LAB_00118217;
      paVar6 = (addr_27b_t *)0x0;
      paVar12 = (addr_27b_t *)0x0;
      if (uVar11 < 0xbc) {
        if (uVar11 < 0xa0) {
          if (uVar11 < 0x38) {
            if (uVar11 == 0x28) {
              lVar23 = 0x3ecac;
            }
            else {
              if (uVar11 != 0x2c) goto LAB_0011825f;
              lVar23 = 0x3ecb4;
            }
          }
          else if (uVar11 == 0x38) {
            lVar23 = 0x3ecbc;
          }
          else {
            if (uVar11 != 0x3c) goto LAB_0011825f;
            lVar23 = 0x3ecc4;
          }
          paVar12 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar23);
        }
        else if (uVar11 < 0xb0) {
          if ((uVar11 != 0xa0) && (uVar11 != 0xa4)) goto LAB_0011825f;
        }
        else if (uVar11 == 0xb0) {
          paVar12 = &bus->DMA0SAD;
        }
        else {
          if (uVar11 != 0xb4) goto LAB_0011825f;
          paVar12 = &bus->DMA0DAD;
        }
LAB_0011808a:
        if (paVar12 == (addr_27b_t *)0x0) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                   ,(ulong)uVar26,0xff00);
          }
        }
        else {
          paVar12->raw = paVar12->raw & 0xffff00ff | uVar19;
        }
        goto LAB_00116777;
      }
      if (uVar11 < 0xd4) {
        if (uVar11 < 200) {
          if (uVar11 == 0xbc) {
            paVar12 = (addr_27b_t *)&bus->DMA1SAD;
          }
          else {
            if (uVar11 != 0xc0) goto LAB_0011825f;
            paVar12 = &bus->DMA1DAD;
          }
        }
        else if (uVar11 == 200) {
          paVar12 = (addr_27b_t *)&bus->DMA2SAD;
        }
        else {
          if (uVar11 != 0xcc) goto LAB_0011825f;
          paVar12 = &bus->DMA2DAD;
        }
        goto LAB_0011808a;
      }
      if (uVar11 < 0x150) {
        if (uVar11 == 0xd4) {
          paVar12 = (addr_27b_t *)&bus->DMA3SAD;
        }
        else {
          if (uVar11 != 0xd8) goto LAB_0011825f;
          paVar12 = (addr_27b_t *)&bus->DMA3DAD;
        }
        goto LAB_0011808a;
      }
      paVar12 = paVar6;
      if (((uVar11 == 0x150) || (uVar11 == 0x154)) || (uVar11 == 0x800)) goto LAB_0011808a;
      goto LAB_0011825f;
    }
    if (io_register_sizes[uVar26 + 0xfc000001] != '\x02') {
      if ((addr & 0xffc | 1) != 0x301) goto LAB_001181e6;
      if ((value >> 8 & 1) == 0) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        goto LAB_00116777;
      }
      goto LAB_001181ed;
    }
    uVar11 = addr & 0xffc;
    switch(uVar11 >> 2) {
    case 0:
      lVar23 = 0x3ec34;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 1:
      lVar23 = 0x3eccc;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 2:
      lVar23 = 0x3ec38;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 3:
      lVar23 = 0x3ec40;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 4:
      lVar23 = 0x3ec48;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 5:
      lVar23 = 0x3ec50;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 6:
      lVar23 = 0x3ec58;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 7:
      lVar23 = 0x3ec60;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 8:
      lVar23 = 0x3ec68;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 9:
      lVar23 = 0x3ec70;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    default:
      goto switchD_001154dc_caseD_a;
    case 0xc:
      lVar23 = 0x3ec78;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0xd:
      lVar23 = 0x3ec80;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x10:
      lVar23 = 0x3ec88;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x11:
      lVar23 = 0x3ec90;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x12:
      lVar23 = 0x3ec98;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x13:
      lVar23 = 0x3ec9c;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x14:
      lVar23 = 0x3eca0;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x15:
      lVar23 = 0x3eca8;
      ppgVar8 = (gbabus_t **)&ppu;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00115d7d:
        printf(pcVar22);
        goto LAB_00115d89;
      }
      pgVar17 = (gbabus_t *)0x0;
      goto LAB_001166f3;
    case 0x22:
      ppgVar8 = &bus;
      lVar23 = 0x96;
      break;
    case 0x2e:
      pgVar17 = (gbabus_t *)&bus->DMA0CNT_L;
      goto LAB_001166f3;
    case 0x31:
      pgVar17 = (gbabus_t *)&bus->DMA1CNT_L;
      goto LAB_001166f3;
    case 0x34:
      pgVar17 = (gbabus_t *)&bus->DMA2CNT_L;
      goto LAB_001166f3;
    case 0x37:
      pgVar17 = (gbabus_t *)&bus->DMA3CNT_L;
      goto LAB_001166f3;
    case 0x40:
      ppgVar8 = &bus;
      lVar23 = 0xa2;
      break;
    case 0x41:
      ppgVar8 = &bus;
      lVar23 = 0xa4;
      break;
    case 0x42:
      ppgVar8 = &bus;
      lVar23 = 0xa6;
      break;
    case 0x43:
      ppgVar8 = &bus;
      lVar23 = 0xa8;
      break;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x54:
    case 0x55:
    case 0x56:
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_00115d7d;
      }
LAB_00115d89:
      pgVar17 = (gbabus_t *)0x0;
      goto LAB_001166f3;
    case 0x4c:
      pgVar17 = (gbabus_t *)&bus->KEYINPUT;
      goto LAB_001166f3;
    case 0x4d:
      ppgVar8 = &bus;
      lVar23 = 0x90;
      break;
    case 0x50:
      ppgVar8 = &bus;
      lVar23 = 0x92;
      break;
    case 0x80:
      pgVar17 = (gbabus_t *)&bus->interrupt_enable;
      goto LAB_001166f3;
    case 0x81:
      ppgVar8 = &bus;
      lVar23 = 0xcc;
      break;
    case 0x82:
      pgVar17 = bus;
      goto LAB_001166f3;
    }
    pgVar17 = (gbabus_t *)((long)((gba_ppu_t *)*ppgVar8)->screen + lVar23 + -2);
LAB_001166f3:
    if (pgVar17 == (gbabus_t *)0x0) {
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
LAB_00115610:
        printf(pcVar22);
      }
    }
    else {
      uVar9 = 0xff00;
      if (uVar11 == 0x208) {
        uVar9 = 1;
      }
      (pgVar17->interrupt_master_enable).raw =
           (uVar18 & 0xff00 ^ (pgVar17->interrupt_master_enable).raw) & uVar9 ^
           (pgVar17->interrupt_master_enable).raw;
      if ((uVar11 - 0xb8 < 0x25) && ((0x1001001001U >> ((ulong)(uVar11 - 0xb8) & 0x3f) & 1) != 0)) {
        gba_dma();
      }
      else if (uVar11 == 0x204) {
        on_waitcnt_updated();
      }
    }
LAB_00116777:
    pgVar24 = ppu;
    if ((io_register_access[uVar26 + 0xfc000002] & ~R) != W) {
      if (gba_log_verbosity != 0) {
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_00116834:
        printf(pcVar22);
      }
      goto LAB_001175fc;
    }
    if (io_register_sizes[uVar26 + 0xfc000002] != '\x04') {
      if (io_register_sizes[uVar26 + 0xfc000002] != '\x02') goto LAB_001181d0;
      uVar10 = addr & 0xffc | 2;
      if (uVar10 < 0x82) {
        if (uVar10 < 0x26) {
          if (uVar10 < 0x12) {
            if (uVar10 < 10) {
              if (uVar10 != 2) {
                if (uVar10 == 6) goto LAB_00116dd4;
                goto LAB_0011821c;
              }
              if (gba_log_verbosity != 0) {
                printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
              }
LAB_00116d19:
              pgVar24 = (gba_ppu_t *)0x0;
              goto LAB_00116dd4;
            }
            if (uVar10 == 10) {
              ppgVar7 = &ppu;
              lVar23 = 0x3ec3c;
            }
            else {
              if (uVar10 != 0xe) goto LAB_0011821c;
              ppgVar7 = &ppu;
              lVar23 = 0x3ec44;
            }
          }
          else if (uVar10 < 0x1a) {
            if (uVar10 == 0x12) {
              ppgVar7 = &ppu;
              lVar23 = 0x3ec4c;
            }
            else {
              if (uVar10 != 0x16) goto LAB_0011821c;
              ppgVar7 = &ppu;
              lVar23 = 0x3ec54;
            }
          }
          else if (uVar10 == 0x1a) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec5c;
          }
          else if (uVar10 == 0x1e) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec64;
          }
          else {
            if (uVar10 != 0x22) goto LAB_0011821c;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec6c;
          }
        }
        else if (uVar10 < 0x46) {
          if (uVar10 < 0x36) {
            if (uVar10 == 0x26) {
              ppgVar7 = &ppu;
              lVar23 = 0x3ec74;
            }
            else {
              if (uVar10 != 0x32) goto LAB_0011821c;
              ppgVar7 = &ppu;
              lVar23 = 0x3ec7c;
            }
          }
          else if (uVar10 == 0x36) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec84;
          }
          else {
            if (uVar10 != 0x42) goto LAB_0011821c;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec8c;
          }
        }
        else if (uVar10 < 0x52) {
          if (uVar10 == 0x46) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec94;
          }
          else {
            if (uVar10 != 0x4a) goto LAB_0011821c;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec9a;
          }
        }
        else {
          if (uVar10 != 0x52) {
            if ((uVar10 == 0x62) || (uVar10 == 0x72)) goto LAB_00116cba;
            goto LAB_0011821c;
          }
          ppgVar7 = &ppu;
          lVar23 = 0x3eca4;
        }
LAB_00116dd1:
        pgVar24 = (gba_ppu_t *)((long)((*ppgVar7)->screen + -1) + 0x3be + lVar23);
LAB_00116dd4:
        if (pgVar24 == (gba_ppu_t *)0x0) {
          if (gba_log_verbosity != 0) {
            pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
            goto LAB_00116834;
          }
        }
        else if (uVar10 == 0x202) {
          (bus->IF).raw = (bus->IF).raw & ~(uVar16 & 0xff);
        }
        else {
          old_value = pgVar24->y;
          *(char *)&pgVar24->y = (char)(value >> 0x10);
          if (uVar10 < 0x102) {
            if (uVar10 < 0xd2) {
              if (uVar10 == 0xba) {
                if (-1 < (short)(bus->DMA0CNT_H).raw) {
                  (bus->DMA0INT).previously_enabled = false;
                }
              }
              else {
                if (uVar10 != 0xc6) goto LAB_001175fc;
                if (-1 < (short)(bus->DMA1CNT_H).raw) {
                  (bus->DMA1INT).previously_enabled = false;
                }
              }
            }
            else if (uVar10 == 0xd2) {
              if (-1 < (short)(bus->DMA2CNT_H).raw) {
                (bus->DMA2INT).previously_enabled = false;
              }
            }
            else {
              if (uVar10 != 0xde) goto LAB_001175fc;
              if (-1 < (short)(bus->DMA3CNT_H).raw) {
                (bus->DMA3INT).previously_enabled = false;
              }
            }
            gba_dma();
          }
          else {
            if (uVar10 < 0x10a) {
              if (uVar10 == 0x102) {
                iVar20 = 0;
              }
              else {
                if (uVar10 != 0x106) goto LAB_001175fc;
                iVar20 = 1;
              }
            }
            else if (uVar10 == 0x10a) {
              iVar20 = 2;
            }
            else {
              if (uVar10 != 0x10e) goto LAB_001175fc;
              iVar20 = 3;
            }
            tmcnth_write(iVar20,old_value);
          }
        }
        goto LAB_001175fc;
      }
      if (uVar10 < 0x102) {
        if (uVar10 < 0xd2) {
          uVar5 = (ulong)(uVar10 - 0x92);
          if (uVar10 - 0x92 < 0x35) {
            if ((0x1111UL >> (uVar5 & 0x3f) & 1) == 0) {
              if (uVar5 == 0x28) {
                pgVar24 = (gba_ppu_t *)&bus->DMA0CNT_H;
              }
              else {
                if (uVar5 != 0x34) goto LAB_00116cad;
                pgVar24 = (gba_ppu_t *)&bus->DMA1CNT_H;
              }
              goto LAB_00116dd4;
            }
          }
          else {
LAB_00116cad:
            if (uVar10 != 0x82) goto LAB_0011821c;
          }
LAB_00116cba:
          if (gba_log_verbosity == 0) {
            pgVar24 = (gba_ppu_t *)0x0;
          }
          else {
            printf("\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m");
            pgVar24 = (gba_ppu_t *)0x0;
          }
        }
        else if (uVar10 == 0xd2) {
          pgVar24 = (gba_ppu_t *)&bus->DMA2CNT_H;
        }
        else {
          if (uVar10 != 0xde) goto LAB_0011821c;
          pgVar24 = (gba_ppu_t *)&bus->DMA3CNT_H;
        }
        goto LAB_00116dd4;
      }
      if (uVar10 < 0x122) {
        if (uVar10 < 0x10a) {
          if (uVar10 == 0x102) {
            lVar23 = 0xac;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
          else {
            if (uVar10 != 0x106) goto LAB_0011821c;
            lVar23 = 0xb0;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
        }
        else if (uVar10 == 0x10a) {
          lVar23 = 0xb4;
          ppgVar7 = (gba_ppu_t **)&bus;
        }
        else {
          if (uVar10 != 0x10e) goto LAB_0011821c;
          lVar23 = 0xb8;
          ppgVar7 = (gba_ppu_t **)&bus;
        }
        goto LAB_00116dd1;
      }
      if (uVar10 < 0x12a) {
        if ((uVar10 == 0x122) || (uVar10 == 0x126)) goto LAB_00116c88;
      }
      else {
        if (uVar10 == 0x12a) {
LAB_00116c88:
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m");
          }
          goto LAB_00116d19;
        }
        if (uVar10 == 0x132) {
          lVar23 = 0x94;
          ppgVar7 = (gba_ppu_t **)&bus;
          goto LAB_00116dd1;
        }
        if (uVar10 == 0x202) {
          pgVar24 = (gba_ppu_t *)&bus->IF;
          goto LAB_00116dd4;
        }
      }
      goto LAB_0011821c;
    }
    uVar19 = value & 0xff0000;
    uVar11 = addr & 0xffc;
    if ((uVar11 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar11 & 0x3f) & 1) != 0)) {
      if ((uVar11 - 0x28 < 0x18) &&
         (uVar10 = uVar11 - 0x28 >> 2, (0x33U >> (uVar10 & 0x1f) & 1) != 0)) {
        lVar23 = *(long *)(&DAT_00127428 + (ulong)uVar10 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00127458 + (ulong)uVar10 * 8))
               = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00127458 + (ulong)uVar10 * 8)) & 0xff00ffff | uVar19;
        }
        *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) =
             *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) & 0xff00ffff | uVar19;
        goto LAB_001175fc;
      }
LAB_001181c6:
      gba_write_word_cold_18();
LAB_001181cb:
      gba_write_word_cold_21();
LAB_001181d0:
      gba_write_word_cold_27();
LAB_001181d7:
      gba_write_word_cold_25();
LAB_001181e1:
      gba_write_word_cold_12();
LAB_001181e6:
      gba_write_word_cold_16();
LAB_001181ed:
      gba_write_word_cold_17();
LAB_001181f2:
      gba_write_word_cold_7();
LAB_001181f7:
      gba_write_word_cold_11();
LAB_00118201:
      gba_write_word_cold_30();
LAB_00118206:
      gba_write_word_cold_20();
      goto LAB_0011820b;
    }
    if (uVar11 != 0xa4) {
      if (uVar11 == 0xa0) {
        iVar20 = 0;
        goto LAB_00116a0f;
      }
      if (0x4000803 < uVar10) {
LAB_00116b62:
        if (gba_log_verbosity != 0) {
          pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00116834;
        }
        goto LAB_001175fc;
      }
      uVar5 = 0x800;
      if ((uVar10 & 0x700fffc) != 0x4000800) {
        uVar5 = (ulong)(uVar10 + 0xfc000000);
      }
      if ((io_register_access[uVar5] & ~R) != W) goto LAB_00116b62;
      if (0x4000803 < uVar10) goto LAB_00118206;
      uVar5 = (ulong)(uVar10 + 0xfc000000);
      if ((uVar10 & 0x700fffc) == 0x4000800) {
        uVar5 = 0x800;
      }
      if (io_register_sizes[uVar5] != '\x04') goto LAB_00118206;
      paVar6 = (addr_27b_t *)0x0;
      paVar12 = (addr_27b_t *)0x0;
      if (uVar11 < 0xbc) {
        if (uVar11 < 0xa0) {
          if (uVar11 < 0x38) {
            if (uVar11 == 0x28) {
              lVar23 = 0x3ecac;
            }
            else {
              if (uVar11 != 0x2c) goto LAB_0011824f;
              lVar23 = 0x3ecb4;
            }
          }
          else if (uVar11 == 0x38) {
            lVar23 = 0x3ecbc;
          }
          else {
            if (uVar11 != 0x3c) goto LAB_0011824f;
            lVar23 = 0x3ecc4;
          }
          paVar12 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar23);
        }
        else if (uVar11 < 0xb0) {
          if ((uVar11 != 0xa0) && (uVar11 != 0xa4)) goto LAB_0011824f;
        }
        else if (uVar11 == 0xb0) {
          paVar12 = &bus->DMA0SAD;
        }
        else {
          if (uVar11 != 0xb4) goto LAB_0011824f;
          paVar12 = &bus->DMA0DAD;
        }
LAB_001175b9:
        if (paVar12 == (addr_27b_t *)0x0) {
          if (gba_log_verbosity != 0) {
            printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                   ,(ulong)uVar26,0xff0000);
          }
        }
        else {
          paVar12->raw = paVar12->raw & 0xff00ffff | uVar19;
        }
        goto LAB_001175fc;
      }
      if (uVar11 < 0xd4) {
        if (uVar11 < 200) {
          if (uVar11 == 0xbc) {
            paVar12 = (addr_27b_t *)&bus->DMA1SAD;
          }
          else {
            if (uVar11 != 0xc0) goto LAB_0011824f;
            paVar12 = &bus->DMA1DAD;
          }
        }
        else if (uVar11 == 200) {
          paVar12 = (addr_27b_t *)&bus->DMA2SAD;
        }
        else {
          if (uVar11 != 0xcc) goto LAB_0011824f;
          paVar12 = &bus->DMA2DAD;
        }
        goto LAB_001175b9;
      }
      if (uVar11 < 0x150) {
        if (uVar11 == 0xd4) {
          paVar12 = (addr_27b_t *)&bus->DMA3SAD;
        }
        else {
          if (uVar11 != 0xd8) goto LAB_0011824f;
          paVar12 = (addr_27b_t *)&bus->DMA3DAD;
        }
        goto LAB_001175b9;
      }
      paVar12 = paVar6;
      if (((uVar11 == 0x150) || (uVar11 == 0x154)) || (uVar11 == 0x800)) goto LAB_001175b9;
      goto LAB_0011824f;
    }
    iVar20 = 1;
LAB_00116a0f:
    write_fifo(apu,iVar20,uVar19,0xff0000);
LAB_001175fc:
    pgVar24 = ppu;
    uVar26 = addr | 3;
    if ((io_register_access[uVar26 + 0xfc000000] & ~R) != W) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_00115250:
      uVar5 = (ulong)uVar26;
      goto LAB_00115253;
    }
    if (io_register_sizes[uVar26 + 0xfc000000] == '\x04') {
      value = value & 0xff000000;
      uVar10 = addr & 0xffc;
      if ((uVar10 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
        if ((uVar10 - 0x28 < 0x18) &&
           (uVar10 = uVar10 - 0x28 >> 2, (0x33U >> (uVar10 & 0x1f) & 1) != 0)) {
          lVar23 = *(long *)(&DAT_00127428 + (ulong)uVar10 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be +
                     *(long *)(&DAT_00127458 + (ulong)uVar10 * 8)) =
                 *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00127458 + (ulong)uVar10 * 8)) & 0xffffff | value;
          }
          *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) =
               *(uint *)((long)(pgVar24->screen + -1) + 0x3be + lVar23) & 0xffffff | value;
          return;
        }
        goto LAB_001181cb;
      }
      if (uVar10 == 0xa4) {
        iVar20 = 1;
LAB_00117887:
        uVar21 = 0xff000000;
LAB_001157b0:
        write_fifo(apu,iVar20,value,uVar21);
        return;
      }
      if (uVar10 == 0xa0) {
        iVar20 = 0;
        goto LAB_00117887;
      }
      uVar26 = addr & 0x7fffffc;
      if (uVar25 != 0x4000800) {
        uVar25 = uVar26;
      }
      if (0x4000803 < uVar25) {
LAB_001179e4:
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
        uVar5 = (ulong)uVar26;
        goto LAB_00115253;
      }
      uVar5 = 0x800;
      if ((uVar25 & 0x700fffc) != 0x4000800) {
        uVar5 = (ulong)(uVar25 + 0xfc000000);
      }
      if ((io_register_access[uVar5] & ~R) != W) goto LAB_001179e4;
      if (0x4000803 < uVar25) {
LAB_0011820b:
        gba_write_word_cold_23();
        goto LAB_00118210;
      }
      uVar5 = (ulong)(uVar25 + 0xfc000000);
      if ((uVar25 & 0x700fffc) == 0x4000800) {
        uVar5 = 0x800;
      }
      if (io_register_sizes[uVar5] != '\x04') goto LAB_0011820b;
      paVar6 = (addr_27b_t *)0x0;
      paVar12 = (addr_27b_t *)0x0;
      if (uVar10 < 0xbc) {
        if (uVar10 < 0xa0) {
          if (uVar10 < 0x38) {
            if (uVar10 == 0x28) {
              lVar23 = 0x3ecac;
            }
            else {
              if (uVar10 != 0x2c) goto LAB_00118257;
              lVar23 = 0x3ecb4;
            }
          }
          else if (uVar10 == 0x38) {
            lVar23 = 0x3ecbc;
          }
          else {
            if (uVar10 != 0x3c) goto LAB_00118257;
            lVar23 = 0x3ecc4;
          }
          paVar12 = (addr_27b_t *)((long)(ppu->screen + -1) + 0x3be + lVar23);
        }
        else if (uVar10 < 0xb0) {
          if ((uVar10 != 0xa0) && (uVar10 != 0xa4)) goto LAB_00118257;
        }
        else if (uVar10 == 0xb0) {
          paVar12 = &bus->DMA0SAD;
        }
        else {
          if (uVar10 != 0xb4) goto LAB_00118257;
          paVar12 = &bus->DMA0DAD;
        }
LAB_00117f50:
        if (paVar12 != (addr_27b_t *)0x0) {
          paVar12->raw = paVar12->raw & 0xffffff | value;
          return;
        }
        if (gba_log_verbosity == 0) {
          return;
        }
        uVar14 = 0xff000000;
LAB_00117015:
        printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m",
               (ulong)uVar26,uVar14);
        return;
      }
      if (uVar10 < 0xd4) {
        if (uVar10 < 200) {
          if (uVar10 == 0xbc) {
            paVar12 = (addr_27b_t *)&bus->DMA1SAD;
          }
          else {
            if (uVar10 != 0xc0) goto LAB_00118257;
            paVar12 = &bus->DMA1DAD;
          }
        }
        else if (uVar10 == 200) {
          paVar12 = (addr_27b_t *)&bus->DMA2SAD;
        }
        else {
          if (uVar10 != 0xcc) goto LAB_00118257;
          paVar12 = &bus->DMA2DAD;
        }
        goto LAB_00117f50;
      }
      if (uVar10 < 0x150) {
        if (uVar10 == 0xd4) {
          paVar12 = (addr_27b_t *)&bus->DMA3SAD;
        }
        else {
          if (uVar10 != 0xd8) goto LAB_00118257;
          paVar12 = (addr_27b_t *)&bus->DMA3DAD;
        }
        goto LAB_00117f50;
      }
      paVar12 = paVar6;
      if (((uVar10 == 0x150) || (uVar10 == 0x154)) || (uVar10 == 0x800)) goto LAB_00117f50;
      goto LAB_00118257;
    }
    if (io_register_sizes[uVar26 + 0xfc000000] != '\x02') goto LAB_001181d7;
    uVar10 = uVar26 & 0x7fffffe;
    uVar26 = uVar26 & 0xffe;
    if (0x81 < uVar26) {
      if (uVar26 < 0x102) {
        if (uVar26 < 0xd2) {
          uVar5 = (ulong)(uVar26 - 0x92);
          if (uVar26 - 0x92 < 0x35) {
            if ((0x1111UL >> (uVar5 & 0x3f) & 1) == 0) {
              if (uVar5 == 0x28) {
                pgVar24 = (gba_ppu_t *)&bus->DMA0CNT_H;
              }
              else {
                if (uVar5 != 0x34) goto LAB_00117b1f;
                pgVar24 = (gba_ppu_t *)&bus->DMA1CNT_H;
              }
              goto LAB_00117c27;
            }
          }
          else {
LAB_00117b1f:
            if (uVar26 != 0x82) goto LAB_00118223;
          }
LAB_00117b2c:
          if (gba_log_verbosity == 0) {
LAB_00117b73:
            pgVar24 = (gba_ppu_t *)0x0;
          }
          else {
            pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00117b3f:
            printf(pcVar22,(ulong)uVar26);
            pgVar24 = (gba_ppu_t *)0x0;
          }
        }
        else if (uVar26 == 0xd2) {
          pgVar24 = (gba_ppu_t *)&bus->DMA2CNT_H;
        }
        else {
          if (uVar26 != 0xde) goto LAB_00118223;
          pgVar24 = (gba_ppu_t *)&bus->DMA3CNT_H;
        }
        goto LAB_00117c27;
      }
      if (uVar26 < 0x122) {
        if (uVar26 < 0x10a) {
          if (uVar26 == 0x102) {
            lVar23 = 0xac;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
          else {
            if (uVar26 != 0x106) goto LAB_00118223;
            lVar23 = 0xb0;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
        }
        else if (uVar26 == 0x10a) {
          lVar23 = 0xb4;
          ppgVar7 = (gba_ppu_t **)&bus;
        }
        else {
          if (uVar26 != 0x10e) goto LAB_00118223;
          lVar23 = 0xb8;
          ppgVar7 = (gba_ppu_t **)&bus;
        }
        goto LAB_00117c24;
      }
      if (uVar26 < 0x12a) {
        if ((uVar26 == 0x122) || (uVar26 == 0x126)) goto LAB_00117b0a;
      }
      else {
        if (uVar26 == 0x12a) {
LAB_00117b0a:
          if (gba_log_verbosity == 0) goto LAB_00117b73;
          pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
          goto LAB_00117b3f;
        }
        if (uVar26 == 0x132) {
          lVar23 = 0x94;
          ppgVar7 = (gba_ppu_t **)&bus;
          goto LAB_00117c24;
        }
        if (uVar26 == 0x202) {
          pgVar24 = (gba_ppu_t *)&bus->IF;
          goto LAB_00117c27;
        }
      }
      goto LAB_00118223;
    }
    if (uVar26 < 0x26) {
      if (uVar26 < 0x12) {
        if (uVar26 < 10) {
          if (uVar26 == 2) {
            if (gba_log_verbosity == 0) goto LAB_00117b73;
            printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
            pgVar24 = (gba_ppu_t *)0x0;
          }
          else if (uVar26 != 6) goto LAB_00118223;
          goto LAB_00117c27;
        }
        if (uVar26 == 10) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec3c;
        }
        else {
          if (uVar26 != 0xe) goto LAB_00118223;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec44;
        }
      }
      else if (uVar26 < 0x1a) {
        if (uVar26 == 0x12) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec4c;
        }
        else {
          if (uVar26 != 0x16) goto LAB_00118223;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec54;
        }
      }
      else if (uVar26 == 0x1a) {
        ppgVar7 = &ppu;
        lVar23 = 0x3ec5c;
      }
      else if (uVar26 == 0x1e) {
        ppgVar7 = &ppu;
        lVar23 = 0x3ec64;
      }
      else {
        if (uVar26 != 0x22) goto LAB_00118223;
        ppgVar7 = &ppu;
        lVar23 = 0x3ec6c;
      }
    }
    else if (uVar26 < 0x46) {
      if (uVar26 < 0x36) {
        if (uVar26 == 0x26) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec74;
        }
        else {
          if (uVar26 != 0x32) goto LAB_00118223;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec7c;
        }
      }
      else if (uVar26 == 0x36) {
        ppgVar7 = &ppu;
        lVar23 = 0x3ec84;
      }
      else {
        if (uVar26 != 0x42) goto LAB_00118223;
        ppgVar7 = &ppu;
        lVar23 = 0x3ec8c;
      }
    }
    else if (uVar26 < 0x52) {
      if (uVar26 == 0x46) {
        ppgVar7 = &ppu;
        lVar23 = 0x3ec94;
      }
      else {
        if (uVar26 != 0x4a) goto LAB_00118223;
        ppgVar7 = &ppu;
        lVar23 = 0x3ec9a;
      }
    }
    else {
      if (uVar26 != 0x52) {
        if ((uVar26 == 0x62) || (uVar26 == 0x72)) goto LAB_00117b2c;
        goto LAB_00118223;
      }
      ppgVar7 = &ppu;
      lVar23 = 0x3eca4;
    }
LAB_00117c24:
    pgVar24 = (gba_ppu_t *)((long)((*ppgVar7)->screen + -1) + 0x3be + lVar23);
LAB_00117c27:
    if (pgVar24 != (gba_ppu_t *)0x0) {
      uVar16 = (ushort)((value >> 0x18) << 8);
      if (uVar26 != 0x202) {
        uVar18 = pgVar24->y;
        pgVar24->y = uVar16 | uVar18 & 0xff;
        goto joined_r0x00117c7f;
      }
      goto LAB_00117c38;
    }
    goto LAB_00117c4d;
  }
  if (0x4000803 < uVar10) {
LAB_001153ad:
    if (gba_log_verbosity != 0) {
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
      goto LAB_001153c0;
    }
    goto LAB_001153ca;
  }
  uVar5 = 0x800;
  if ((uVar10 & 0x700fffc) != 0x4000800) {
    uVar5 = (ulong)(uVar10 + 0xfc000000);
  }
  if ((io_register_access[uVar5] & ~R) != W) goto LAB_001153ad;
  uVar10 = addr & 0xffc;
  switch(uVar10 >> 2) {
  case 0:
    lVar23 = 0x3ec34;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 1:
    lVar23 = 0x3eccc;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 2:
    lVar23 = 0x3ec38;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 3:
    lVar23 = 0x3ec40;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 4:
    lVar23 = 0x3ec48;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 5:
    lVar23 = 0x3ec50;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 6:
    lVar23 = 0x3ec58;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 7:
    lVar23 = 0x3ec60;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 8:
    lVar23 = 0x3ec68;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 9:
    lVar23 = 0x3ec70;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  default:
    goto switchD_0011537b_caseD_a;
  case 0xc:
    lVar23 = 0x3ec78;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0xd:
    lVar23 = 0x3ec80;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x10:
    lVar23 = 0x3ec88;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x11:
    lVar23 = 0x3ec90;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x12:
    lVar23 = 0x3ec98;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x13:
    lVar23 = 0x3ec9c;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x14:
    lVar23 = 0x3eca0;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x15:
    lVar23 = 0x3eca8;
    ppgVar8 = (gbabus_t **)&ppu;
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    if (gba_log_verbosity == 0) goto LAB_00115b6f;
    pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00115b5d:
    pgVar17 = (gbabus_t *)0x0;
    printf(pcVar22,(ulong)uVar10);
    goto LAB_00116395;
  case 0x22:
    ppgVar8 = &bus;
    lVar23 = 0x96;
    break;
  case 0x2e:
    pgVar17 = (gbabus_t *)&bus->DMA0CNT_L;
    goto LAB_00116395;
  case 0x31:
    pgVar17 = (gbabus_t *)&bus->DMA1CNT_L;
    goto LAB_00116395;
  case 0x34:
    pgVar17 = (gbabus_t *)&bus->DMA2CNT_L;
    goto LAB_00116395;
  case 0x37:
    pgVar17 = (gbabus_t *)&bus->DMA3CNT_L;
    goto LAB_00116395;
  case 0x40:
    ppgVar8 = &bus;
    lVar23 = 0xa2;
    break;
  case 0x41:
    ppgVar8 = &bus;
    lVar23 = 0xa4;
    break;
  case 0x42:
    ppgVar8 = &bus;
    lVar23 = 0xa6;
    break;
  case 0x43:
    ppgVar8 = &bus;
    lVar23 = 0xa8;
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x54:
  case 0x55:
  case 0x56:
    if (gba_log_verbosity != 0) {
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
      goto LAB_00115b5d;
    }
LAB_00115b6f:
    pgVar17 = (gbabus_t *)0x0;
    goto LAB_00116395;
  case 0x4c:
    pgVar17 = (gbabus_t *)&bus->KEYINPUT;
    goto LAB_00116395;
  case 0x4d:
    ppgVar8 = &bus;
    lVar23 = 0x90;
    break;
  case 0x50:
    ppgVar8 = &bus;
    lVar23 = 0x92;
    break;
  case 0x80:
    pgVar17 = (gbabus_t *)&bus->interrupt_enable;
    goto LAB_00116395;
  case 0x81:
    ppgVar8 = &bus;
    lVar23 = 0xcc;
    break;
  case 0x82:
    pgVar17 = bus;
    goto LAB_00116395;
  }
  pgVar17 = (gbabus_t *)((long)((gba_ppu_t *)*ppgVar8)->screen + lVar23 + -2);
LAB_00116395:
  if (pgVar17 == (gbabus_t *)0x0) {
    if (gba_log_verbosity != 0) {
      pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
LAB_001153c0:
      printf(pcVar22,(ulong)uVar26);
    }
  }
  else {
    uVar9 = 0xfff8;
    if (uVar10 != 4) {
      uVar9 = (ushort)(uVar10 == 0x208) * 2 - 1;
    }
    (pgVar17->interrupt_master_enable).raw =
         (uVar18 ^ (pgVar17->interrupt_master_enable).raw) & uVar9 ^
         (pgVar17->interrupt_master_enable).raw;
    if ((uVar10 - 0xb8 < 0x25) && ((0x1001001001U >> ((ulong)(uVar10 - 0xb8) & 0x3f) & 1) != 0)) {
      gba_dma();
    }
    else if (uVar10 == 0x204) {
      on_waitcnt_updated();
    }
  }
LAB_001153ca:
  uVar10 = uVar26 | 2;
  if ((io_register_access[uVar26 + 0xfc000002] & ~R) == W) {
    uVar26 = addr & 0xffc | 2;
    if (uVar26 < 0x82) {
      if (uVar26 < 0x26) {
        if (uVar26 < 0x12) {
          if (uVar26 < 10) {
            if (uVar26 == 2) {
              if (gba_log_verbosity == 0) goto LAB_00115e48;
              printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
              pgVar24 = (gba_ppu_t *)0x0;
            }
            else {
              pgVar24 = ppu;
              if (uVar26 != 6) goto LAB_00118210;
            }
            goto LAB_00115efc;
          }
          if (uVar26 == 10) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec3c;
          }
          else {
            if (uVar26 != 0xe) goto LAB_00118210;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec44;
          }
        }
        else if (uVar26 < 0x1a) {
          if (uVar26 == 0x12) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec4c;
          }
          else {
            if (uVar26 != 0x16) goto LAB_00118210;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec54;
          }
        }
        else if (uVar26 == 0x1a) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec5c;
        }
        else if (uVar26 == 0x1e) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec64;
        }
        else {
          if (uVar26 != 0x22) goto LAB_00118210;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec6c;
        }
      }
      else if (uVar26 < 0x46) {
        if (uVar26 < 0x36) {
          if (uVar26 == 0x26) {
            ppgVar7 = &ppu;
            lVar23 = 0x3ec74;
          }
          else {
            if (uVar26 != 0x32) goto LAB_00118210;
            ppgVar7 = &ppu;
            lVar23 = 0x3ec7c;
          }
        }
        else if (uVar26 == 0x36) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec84;
        }
        else {
          if (uVar26 != 0x42) goto LAB_00118210;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec8c;
        }
      }
      else if (uVar26 < 0x52) {
        if (uVar26 == 0x46) {
          ppgVar7 = &ppu;
          lVar23 = 0x3ec94;
        }
        else {
          if (uVar26 != 0x4a) goto LAB_00118210;
          ppgVar7 = &ppu;
          lVar23 = 0x3ec9a;
        }
      }
      else {
        if (uVar26 != 0x52) {
          if ((uVar26 == 0x62) || (uVar26 == 0x72)) goto LAB_00115e01;
          goto LAB_00118210;
        }
        ppgVar7 = &ppu;
        lVar23 = 0x3eca4;
      }
LAB_00115ef9:
      pgVar24 = (gba_ppu_t *)((long)((*ppgVar7)->screen + -1) + 0x3be + lVar23);
    }
    else {
      if (0x101 < uVar26) {
        if (uVar26 < 0x122) {
          if (uVar26 < 0x10a) {
            if (uVar26 == 0x102) {
              lVar23 = 0xac;
              ppgVar7 = (gba_ppu_t **)&bus;
            }
            else {
              if (uVar26 != 0x106) goto LAB_00118210;
              lVar23 = 0xb0;
              ppgVar7 = (gba_ppu_t **)&bus;
            }
          }
          else if (uVar26 == 0x10a) {
            lVar23 = 0xb4;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
          else {
            if (uVar26 != 0x10e) goto LAB_00118210;
            lVar23 = 0xb8;
            ppgVar7 = (gba_ppu_t **)&bus;
          }
          goto LAB_00115ef9;
        }
        if (uVar26 < 0x12a) {
          if ((uVar26 == 0x122) || (uVar26 == 0x126)) goto LAB_00115c7e;
        }
        else {
          if (uVar26 == 0x12a) {
LAB_00115c7e:
            if (gba_log_verbosity == 0) goto LAB_00115e48;
            pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
            goto LAB_00115e14;
          }
          if (uVar26 == 0x132) {
            lVar23 = 0x94;
            ppgVar7 = (gba_ppu_t **)&bus;
            goto LAB_00115ef9;
          }
          if (uVar26 == 0x202) {
            pgVar24 = (gba_ppu_t *)&bus->IF;
            goto LAB_00115efc;
          }
        }
LAB_00118210:
        gba_write_word_cold_6();
LAB_00118217:
        gba_write_word_cold_14();
LAB_0011821c:
        gba_write_word_cold_26();
LAB_00118223:
        gba_write_word_cold_24();
LAB_0011822a:
        gba_write_word_cold_9();
switchD_0011537b_caseD_a:
        gba_write_word_cold_5();
LAB_00118237:
        gba_write_word_cold_29();
switchD_001154dc_caseD_a:
        gba_write_word_cold_15();
switchD_001158dd_caseD_a:
        gba_write_word_cold_10();
LAB_0011824f:
        gba_write_word_cold_19();
LAB_00118257:
        gba_write_word_cold_22();
LAB_0011825f:
        gba_write_word_cold_13();
LAB_00118267:
        gba_write_word_cold_8();
      }
      if (uVar26 < 0xd2) {
        uVar5 = (ulong)(uVar26 - 0x92);
        if (uVar26 - 0x92 < 0x35) {
          if ((0x1111UL >> (uVar5 & 0x3f) & 1) == 0) {
            if (uVar5 == 0x28) {
              pgVar24 = (gba_ppu_t *)&bus->DMA0CNT_H;
            }
            else {
              if (uVar5 != 0x34) goto LAB_00115df4;
              pgVar24 = (gba_ppu_t *)&bus->DMA1CNT_H;
            }
            goto LAB_00115efc;
          }
        }
        else {
LAB_00115df4:
          if (uVar26 != 0x82) goto LAB_00118210;
        }
LAB_00115e01:
        if (gba_log_verbosity == 0) {
LAB_00115e48:
          pgVar24 = (gba_ppu_t *)0x0;
        }
        else {
          pcVar22 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00115e14:
          printf(pcVar22,(ulong)uVar26);
          pgVar24 = (gba_ppu_t *)0x0;
        }
      }
      else if (uVar26 == 0xd2) {
        pgVar24 = (gba_ppu_t *)&bus->DMA2CNT_H;
      }
      else {
        if (uVar26 != 0xde) goto LAB_00118210;
        pgVar24 = (gba_ppu_t *)&bus->DMA3CNT_H;
      }
    }
LAB_00115efc:
    if (pgVar24 != (gba_ppu_t *)0x0) {
      if (uVar26 != 0x202) {
        uVar18 = pgVar24->y;
        pgVar24->y = uVar16;
joined_r0x00117c7f:
        if (0x101 < uVar26) {
          if (uVar26 < 0x10a) {
            if (uVar26 == 0x102) {
              iVar20 = 0;
            }
            else {
              if (uVar26 != 0x106) {
                return;
              }
              iVar20 = 1;
            }
          }
          else if (uVar26 == 0x10a) {
            iVar20 = 2;
          }
          else {
            if (uVar26 != 0x10e) {
              return;
            }
            iVar20 = 3;
          }
          tmcnth_write(iVar20,uVar18);
          return;
        }
        if (uVar26 < 0xd2) {
          if (uVar26 == 0xba) {
            if (-1 < (short)((DMACNTH_t *)((long)bus + 0x1c))->raw) {
              ((DMAINT_t *)((long)bus + 0x20))->previously_enabled = false;
            }
          }
          else {
            if (uVar26 != 0xc6) {
              return;
            }
            if (-1 < (short)((DMACNTH_t *)((long)bus + 0x3c))->raw) {
              ((DMAINT_t *)((long)bus + 0x40))->previously_enabled = false;
            }
          }
        }
        else if (uVar26 == 0xd2) {
          if (-1 < (short)((DMACNTH_t *)((long)bus + 0x5c))->raw) {
            ((DMAINT_t *)((long)bus + 0x60))->previously_enabled = false;
          }
        }
        else {
          if (uVar26 != 0xde) {
            return;
          }
          if (-1 < (short)((DMACNTH_t *)((long)bus + 0x7c))->raw) {
            ((DMAINT_t *)((long)bus + 0x80))->previously_enabled = false;
          }
        }
        gba_dma();
        return;
      }
LAB_00117c38:
      (bus->IF).raw = (bus->IF).raw & ~uVar16;
switchD_00115049_caseD_1:
      return;
    }
LAB_00117c4d:
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
  }
  else {
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar22 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
  }
  uVar5 = (ulong)uVar10;
LAB_00115253:
  printf(pcVar22,uVar5);
  return;
}

Assistant:

void gba_write_word(word addr, word value, access_type_t access_type) {
    addr &= ~(sizeof(word) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(word), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            word_to_byte_array(mem->ewram, index, value);
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            word_to_byte_array(mem->iwram, index, value);
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                byte size = get_ioreg_size_for_addr(addr);
                switch (size) {
                    case 0:
                        return;
                    case sizeof(byte):
                        write_byte_ioreg(addr, value & 0xFF);
                        write_byte_ioreg(addr + 1, (value >> 8) & 0xFF);
                        write_byte_ioreg(addr + 2, (value >> 16) & 0xFF);
                        write_byte_ioreg(addr + 3, (value >> 24) & 0xFF);
                        break;
                    case sizeof(half):
                        write_half_ioreg(addr, value & 0xFFFF);
                        write_half_ioreg(addr + 2, (value >> 16) & 0xFFFF);
                        break;
                    case sizeof(word):
                        write_word_ioreg(addr, value);
                }
            }

#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr >= 0x4FFF600 && addr < 0x4FFF700) {
                    mgba_debug_write_byte(addr, value & 0xFF);
                    mgba_debug_write_byte(addr + 1, (value >> 8) & 0xFF);
                    mgba_debug_write_byte(addr + 2, (value >> 16) & 0xFF);
                    mgba_debug_write_byte(addr + 3, (value >> 24) & 0xFF);
                } else {
                    logfatal("Writing 0x%08X to 0x%08X\n", value, addr);
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word_to_byte_array(ppu->pram, index, value);
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            word_to_byte_array(ppu->vram, index, value);
            break;
        }
        case REGION_OAM: {
            word index = addr - 0x07000000;
            index %= OAM_SIZE;
            ppu->oam[index] = value;
            word_to_byte_array(ppu->oam, index, value);
            break;
        }
        case REGION_GAMEPAK0_L:
            switch (addr) {
                case 0x080000C4:
                    gpio_write(0x080000C4, value & 0xFFFF);
                    gpio_write(0x080000C6, (value >> 16) & 0xFFFF);
                    return;
                case 0x080000C8:
                    gpio_write(0x080000C8, value & 0xFFFF);
                    return;
                default:
                    break;
            }
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write word 0x%08X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    word_to_byte_array(mem->backup, addr & 0x7FFF, value);
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logfatal("Backup type EEPROM unimplemented!")
                case FLASH64K:
                case FLASH128K:
                    logfatal("Writing word to flash unimplemented")
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
        default:
            return;
    }
}